

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenOfCategory
          (DiagnosticsReporter *this,Category category,string *id)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  SyntaxToken *this_00;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  undefined8 uVar9;
  string s;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  DiagnosticDescriptor local_b8;
  string local_50;
  
  to_string_abi_cxx11_(&local_50,(C *)CONCAT44(in_register_00000034,category),(Category)id);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x46f4e6);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_128 = *plVar6;
    lStack_120 = plVar4[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar6;
    local_138 = (long *)*plVar4;
  }
  local_130 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_188 = *puVar7;
    lStack_180 = plVar4[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar7;
    local_198 = (ulong *)*plVar4;
  }
  local_190 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_178,this_00);
  uVar8 = 0xf;
  if (local_198 != &local_188) {
    uVar8 = local_188;
  }
  if (uVar8 < local_178._M_string_length + local_190) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar9 = local_178.field_2._M_allocated_capacity;
    }
    if (local_178._M_string_length + local_190 <= (ulong)uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_198);
      goto LAB_002b28e1;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
LAB_002b28e1:
  local_b8.id_._M_dataplus._M_p = (pointer)&local_b8.id_.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.id_.field_2._M_allocated_capacity = *psVar1;
    local_b8.id_.field_2._8_8_ = puVar5[3];
  }
  else {
    local_b8.id_.field_2._M_allocated_capacity = *psVar1;
    local_b8.id_._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_b8.id_._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_148 = *plVar6;
    lStack_140 = plVar4[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar6;
    local_158 = (long *)*plVar4;
  }
  local_150 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar2 = &local_b8.id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (id->_M_dataplus)._M_p;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)local_d8,pcVar3,pcVar3 + id->_M_string_length)
  ;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"[[expected token of category]]","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,local_158,local_150 + (long)local_158);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_b8,local_d8,local_f8,local_118,2,1);
  diagnoseOrDelayDiagnostic(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.description_._M_dataplus._M_p != &local_b8.description_.field_2) {
    operator_delete(local_b8.description_._M_dataplus._M_p,
                    local_b8.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.title_._M_dataplus._M_p != &local_b8.title_.field_2) {
    operator_delete(local_b8.title_._M_dataplus._M_p,
                    local_b8.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenOfCategory(SyntaxToken::Category category,
                                                          const std::string& id)
{
    std::string s = "expected "
            + to_string(category)
            + " got `"
            + parser_->peek().valueText() + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(id,
                                     "[[expected token of category]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}